

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pwd.c
# Opt level: O2

int pwdMain(int argc,char **argv)

{
  int iVar1;
  err_t code;
  cmd_pwd_t in_RAX;
  char *pcVar2;
  int iVar3;
  cmd_pwd_t pwd;
  
  if (argc < 3) {
    printf("bee2cmd/%s: %s\nUsage:\n  pwd gen <schema>\n    generate password according to <schema>\n  pwd val <schema>\n    validate password built by <schema>\n  pwd print <schema>\n    print password built by <schema>\n  schemas:\n    pass:<pwd> -- direct password\n    env:<name> -- password in environment variable <name>\n    share:\"[options] <share1> <share2> ...\" -- shared password\n      options:\n        -t<nn> --- threshold (2 <= <nn> <= 16, 2 by default)\n        -l<mmm> --- password bitlen: 128, 192 or 256 (by default)\n        -crc --- password contains 64-bit crc (<mmm> != 128)\n        -pass <schema> --- password to protect shares\n"
           ,"pwd","generate and manage passwords");
    return -1;
  }
  pwd = in_RAX;
  iVar1 = strCmp(argv[1],"gen");
  iVar3 = -1;
  if (iVar1 == 0) {
    pwd = (cmd_pwd_t)0x0;
    code = 0x25b;
    if ((argc == 3) && (code = cmdStDo(0x16), code == 0)) {
      code = cmdPwdGen(&pwd,argv[2]);
LAB_0010babe:
      cmdPwdClose(pwd);
    }
  }
  else {
    iVar1 = strCmp(argv[1],"val");
    if (iVar1 == 0) {
      pwd = (cmd_pwd_t)0x0;
      code = 0x25b;
      if ((argc == 3) && (code = cmdStDo(6), code == 0)) {
        code = cmdPwdRead(&pwd,argv[2]);
        goto LAB_0010babe;
      }
    }
    else {
      iVar1 = strCmp(argv[1],"print");
      code = 0x259;
      if (iVar1 != 0) goto LAB_0010bacc;
      pwd = (cmd_pwd_t)0x0;
      code = 0x25b;
      if ((argc == 3) && (code = cmdPwdRead(&pwd,argv[2]), code == 0)) {
        puts(pwd);
        cmdPwdClose(pwd);
        code = 0;
      }
    }
  }
  if (code == 0) {
    iVar1 = strCmp(argv[1],"val");
    iVar3 = 0;
    code = 0;
    if (iVar1 != 0) {
      return 0;
    }
  }
LAB_0010bacc:
  pcVar2 = errMsg(code);
  printf("bee2cmd/%s: %s\n","pwd",pcVar2);
  return iVar3;
}

Assistant:

int pwdMain(int argc, char* argv[])
{
	err_t code;
	// справка
	if (argc < 3)
		return pwdUsage();
	// разбор
	++argv, --argc;
	if (strEq(argv[0], "gen"))
		code = pwdGen(argc - 1, argv + 1);
	else if (strEq(argv[0], "val"))
		code = pwdVal(argc - 1, argv + 1);
	else if (strEq(argv[0], "print"))
		code = pwdPrint(argc - 1, argv + 1);
	else
		code = ERR_CMD_NOT_FOUND;
	// завершить
	if (code != ERR_OK || strEq(argv[0], "val"))
		printf("bee2cmd/%s: %s\n", _name, errMsg(code));
	return code != ERR_OK ? -1 : 0;
}